

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O3

bool __thiscall
BamTools::Fasta::FastaPrivate::GetNameFromHeader(FastaPrivate *this,string *header,string *name)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string s;
  char *local_58 [2];
  char local_48 [16];
  undefined1 *local_38;
  uint local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::substr((ulong)&local_38,(ulong)header);
  uVar6 = 0;
  do {
    if ((0x20 < (ulong)(byte)local_38[uVar6]) ||
       ((0x100002600U >> ((ulong)(byte)local_38[uVar6] & 0x3f) & 1) == 0)) {
      if ((uint)uVar6 < local_30) {
        uVar5 = uVar6 & 0xffffffff;
        goto LAB_00168574;
      }
      break;
    }
    uVar6 = uVar6 + 1;
  } while (local_30 != (uint)uVar6);
  goto LAB_00168507;
  while (uVar3 = (uint)uVar5 + 1, uVar5 = (ulong)uVar3, uVar4 = local_30, local_30 != uVar3) {
LAB_00168574:
    if (((ulong)(byte)local_38[uVar5] < 0x21) &&
       (uVar4 = (uint)uVar5, (0x100002600U >> ((ulong)(byte)local_38[uVar5] & 0x3f) & 1) != 0))
    break;
  }
  if (uVar4 != (uint)uVar6) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)&local_38);
    pcVar2 = local_58[0];
    pcVar1 = (char *)name->_M_string_length;
    strlen(local_58[0]);
    std::__cxx11::string::_M_replace((ulong)name,0,pcVar1,(ulong)pcVar2);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    bVar7 = true;
    goto LAB_0016854f;
  }
LAB_00168507:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"FASTA error : could not parse read name from FASTA header",0x39)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  bVar7 = false;
LAB_0016854f:
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return bVar7;
}

Assistant:

bool Fasta::FastaPrivate::GetNameFromHeader(const std::string& header, std::string& name)
{

    // get rid of the leading greater than sign
    std::string s = header.substr(1);

    // extract the first non-whitespace segment
    char* pName = (char*)s.data();
    unsigned int nameLen = (unsigned int)s.size();

    unsigned int start = 0;
    while ((pName[start] == 32) || (pName[start] == 9) || (pName[start] == 10) ||
           (pName[start] == 13)) {
        start++;
        if (start == nameLen) {
            break;
        }
    }

    unsigned int stop = start;
    if (stop < nameLen) {
        while ((pName[stop] != 32) && (pName[stop] != 9) && (pName[stop] != 10) &&
               (pName[stop] != 13)) {
            stop++;
            if (stop == nameLen) {
                break;
            }
        }
    }

    if (start == stop) {
        std::cerr << "FASTA error : could not parse read name from FASTA header" << std::endl;
        return false;
    }

    name = s.substr(start, stop - start).c_str();
    return true;
}